

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  long lVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined4 uVar90;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  ulong uVar105;
  long lVar106;
  uint uVar107;
  ulong uVar108;
  ulong uVar109;
  ulong uVar110;
  ulong uVar111;
  ulong *puVar112;
  ulong uVar113;
  ulong uVar114;
  ulong uVar115;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  float fVar128;
  float fVar132;
  float fVar133;
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar131 [64];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [64];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [64];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  float fVar150;
  undefined1 auVar151 [32];
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar152 [64];
  undefined1 auVar159 [32];
  uint uVar161;
  uint uVar162;
  uint uVar163;
  uint uVar164;
  uint uVar165;
  uint uVar166;
  uint uVar167;
  undefined1 auVar160 [64];
  undefined1 auVar168 [32];
  undefined1 auVar169 [64];
  float fVar170;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar171 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_1654;
  Scene *local_1650;
  Geometry *local_1648;
  ulong local_1640;
  long local_1638;
  ulong local_1630;
  long local_1628;
  undefined1 local_1620 [32];
  float local_1600;
  float local_15fc;
  float local_15f8;
  float local_15f4;
  undefined4 local_15f0;
  undefined4 local_15ec;
  uint local_15e8;
  uint local_15e4;
  uint local_15e0;
  RTCFilterFunctionNArguments local_15d0;
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [8];
  float fStack_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  float fStack_14e8;
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_12e0 [32];
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined4 uStack_12a4;
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined4 uStack_1204;
  ulong local_1200;
  ulong local_11f8 [569];
  
  local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200 != 8) {
    fVar128 = ray->tfar;
    if (0.0 <= fVar128) {
      puVar112 = local_11f8;
      aVar3 = (ray->dir).field_0;
      auVar10 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar129._8_4_ = 0x7fffffff;
      auVar129._0_8_ = 0x7fffffff7fffffff;
      auVar129._12_4_ = 0x7fffffff;
      auVar129 = vandps_avx((undefined1  [16])aVar3,auVar129);
      auVar140._8_4_ = 0x219392ef;
      auVar140._0_8_ = 0x219392ef219392ef;
      auVar140._12_4_ = 0x219392ef;
      auVar129 = vcmpps_avx(auVar129,auVar140,1);
      auVar129 = vblendvps_avx((undefined1  [16])aVar3,auVar140,auVar129);
      auVar140 = vrcpps_avx(auVar129);
      fVar133 = auVar140._0_4_;
      auVar125._0_4_ = fVar133 * auVar129._0_4_;
      fVar134 = auVar140._4_4_;
      auVar125._4_4_ = fVar134 * auVar129._4_4_;
      fVar135 = auVar140._8_4_;
      auVar125._8_4_ = fVar135 * auVar129._8_4_;
      fVar137 = auVar140._12_4_;
      auVar125._12_4_ = fVar137 * auVar129._12_4_;
      auVar141._8_4_ = 0x3f800000;
      auVar141._0_8_ = 0x3f8000003f800000;
      auVar141._12_4_ = 0x3f800000;
      auVar129 = vsubps_avx(auVar141,auVar125);
      uVar1 = *(undefined4 *)&(ray->org).field_0;
      local_13e0._4_4_ = uVar1;
      local_13e0._0_4_ = uVar1;
      local_13e0._8_4_ = uVar1;
      local_13e0._12_4_ = uVar1;
      local_13e0._16_4_ = uVar1;
      local_13e0._20_4_ = uVar1;
      local_13e0._24_4_ = uVar1;
      local_13e0._28_4_ = uVar1;
      auVar147 = ZEXT3264(local_13e0);
      uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1400._4_4_ = uVar1;
      local_1400._0_4_ = uVar1;
      local_1400._8_4_ = uVar1;
      local_1400._12_4_ = uVar1;
      local_1400._16_4_ = uVar1;
      local_1400._20_4_ = uVar1;
      local_1400._24_4_ = uVar1;
      local_1400._28_4_ = uVar1;
      auVar149 = ZEXT3264(local_1400);
      uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1420._4_4_ = uVar1;
      local_1420._0_4_ = uVar1;
      local_1420._8_4_ = uVar1;
      local_1420._12_4_ = uVar1;
      local_1420._16_4_ = uVar1;
      local_1420._20_4_ = uVar1;
      local_1420._24_4_ = uVar1;
      local_1420._28_4_ = uVar1;
      auVar152 = ZEXT3264(local_1420);
      auVar126._0_4_ = fVar133 + fVar133 * auVar129._0_4_;
      auVar126._4_4_ = fVar134 + fVar134 * auVar129._4_4_;
      auVar126._8_4_ = fVar135 + fVar135 * auVar129._8_4_;
      auVar126._12_4_ = fVar137 + fVar137 * auVar129._12_4_;
      auVar129 = vshufps_avx(auVar126,auVar126,0);
      local_1440._16_16_ = auVar129;
      local_1440._0_16_ = auVar129;
      auVar160 = ZEXT3264(local_1440);
      auVar129 = vmovshdup_avx(auVar126);
      auVar140 = vshufps_avx(auVar126,auVar126,0x55);
      local_1460._16_16_ = auVar140;
      local_1460._0_16_ = auVar140;
      auVar169 = ZEXT3264(local_1460);
      auVar140 = vshufpd_avx(auVar126,auVar126,1);
      auVar125 = vshufps_avx(auVar126,auVar126,0xaa);
      uVar113 = (ulong)(auVar126._0_4_ < 0.0) << 5;
      local_1480._16_16_ = auVar125;
      local_1480._0_16_ = auVar125;
      auVar127 = ZEXT3264(local_1480);
      uVar111 = (ulong)(auVar129._0_4_ < 0.0) << 5 | 0x40;
      uVar114 = (ulong)(auVar140._0_4_ < 0.0) << 5 | 0x80;
      uVar115 = uVar113 ^ 0x20;
      auVar129 = vshufps_avx(auVar10,auVar10,0);
      local_14a0._16_16_ = auVar129;
      local_14a0._0_16_ = auVar129;
      auVar131 = ZEXT3264(local_14a0);
      auVar129 = vshufps_avx(ZEXT416((uint)fVar128),ZEXT416((uint)fVar128),0);
      local_1520._16_16_ = mm_lookupmask_ps._240_16_;
      local_1520._0_16_ = mm_lookupmask_ps._240_16_;
      local_14e0 = vperm2f128_avx(local_1520,mm_lookupmask_ps._0_32_,2);
      local_14c0._16_16_ = auVar129;
      local_14c0._0_16_ = auVar129;
      auVar144 = ZEXT3264(local_14c0);
      auVar116._8_4_ = 0xbf800000;
      auVar116._0_8_ = 0xbf800000bf800000;
      auVar116._12_4_ = 0xbf800000;
      auVar116._16_4_ = 0xbf800000;
      auVar116._20_4_ = 0xbf800000;
      auVar116._24_4_ = 0xbf800000;
      auVar116._28_4_ = 0xbf800000;
      auVar122._8_4_ = 0x3f800000;
      auVar122._0_8_ = 0x3f8000003f800000;
      auVar122._12_4_ = 0x3f800000;
      auVar122._16_4_ = 0x3f800000;
      auVar122._20_4_ = 0x3f800000;
      auVar122._24_4_ = 0x3f800000;
      auVar122._28_4_ = 0x3f800000;
      _local_1500 = vblendvps_avx(auVar122,auVar116,local_14e0);
      local_1630 = uVar111;
      uVar109 = uVar111;
LAB_002ea019:
      do {
        uVar110 = puVar112[-1];
        puVar112 = puVar112 + -1;
        while ((uVar110 & 8) == 0) {
          auVar116 = vsubps_avx(*(undefined1 (*) [32])(uVar110 + 0x40 + uVar113),auVar147._0_32_);
          auVar75._4_4_ = auVar160._4_4_ * auVar116._4_4_;
          auVar75._0_4_ = auVar160._0_4_ * auVar116._0_4_;
          auVar75._8_4_ = auVar160._8_4_ * auVar116._8_4_;
          auVar75._12_4_ = auVar160._12_4_ * auVar116._12_4_;
          auVar75._16_4_ = auVar160._16_4_ * auVar116._16_4_;
          auVar75._20_4_ = auVar160._20_4_ * auVar116._20_4_;
          auVar75._24_4_ = auVar160._24_4_ * auVar116._24_4_;
          auVar75._28_4_ = auVar116._28_4_;
          auVar116 = vsubps_avx(*(undefined1 (*) [32])(uVar110 + 0x40 + uVar109),auVar149._0_32_);
          auVar76._4_4_ = auVar169._4_4_ * auVar116._4_4_;
          auVar76._0_4_ = auVar169._0_4_ * auVar116._0_4_;
          auVar76._8_4_ = auVar169._8_4_ * auVar116._8_4_;
          auVar76._12_4_ = auVar169._12_4_ * auVar116._12_4_;
          auVar76._16_4_ = auVar169._16_4_ * auVar116._16_4_;
          auVar76._20_4_ = auVar169._20_4_ * auVar116._20_4_;
          auVar76._24_4_ = auVar169._24_4_ * auVar116._24_4_;
          auVar76._28_4_ = auVar116._28_4_;
          auVar116 = vmaxps_avx(auVar75,auVar76);
          auVar122 = vsubps_avx(*(undefined1 (*) [32])(uVar110 + 0x40 + uVar114),auVar152._0_32_);
          auVar77._4_4_ = auVar127._4_4_ * auVar122._4_4_;
          auVar77._0_4_ = auVar127._0_4_ * auVar122._0_4_;
          auVar77._8_4_ = auVar127._8_4_ * auVar122._8_4_;
          auVar77._12_4_ = auVar127._12_4_ * auVar122._12_4_;
          auVar77._16_4_ = auVar127._16_4_ * auVar122._16_4_;
          auVar77._20_4_ = auVar127._20_4_ * auVar122._20_4_;
          auVar77._24_4_ = auVar127._24_4_ * auVar122._24_4_;
          auVar77._28_4_ = auVar122._28_4_;
          auVar122 = vmaxps_avx(auVar77,auVar131._0_32_);
          auVar116 = vmaxps_avx(auVar116,auVar122);
          auVar122 = vsubps_avx(*(undefined1 (*) [32])(uVar110 + 0x40 + uVar115),auVar147._0_32_);
          auVar78._4_4_ = auVar160._4_4_ * auVar122._4_4_;
          auVar78._0_4_ = auVar160._0_4_ * auVar122._0_4_;
          auVar78._8_4_ = auVar160._8_4_ * auVar122._8_4_;
          auVar78._12_4_ = auVar160._12_4_ * auVar122._12_4_;
          auVar78._16_4_ = auVar160._16_4_ * auVar122._16_4_;
          auVar78._20_4_ = auVar160._20_4_ * auVar122._20_4_;
          auVar78._24_4_ = auVar160._24_4_ * auVar122._24_4_;
          auVar78._28_4_ = auVar122._28_4_;
          auVar122 = vsubps_avx(*(undefined1 (*) [32])(uVar110 + 0x40 + (uVar111 ^ 0x20)),
                                auVar149._0_32_);
          auVar79._4_4_ = auVar169._4_4_ * auVar122._4_4_;
          auVar79._0_4_ = auVar169._0_4_ * auVar122._0_4_;
          auVar79._8_4_ = auVar169._8_4_ * auVar122._8_4_;
          auVar79._12_4_ = auVar169._12_4_ * auVar122._12_4_;
          auVar79._16_4_ = auVar169._16_4_ * auVar122._16_4_;
          auVar79._20_4_ = auVar169._20_4_ * auVar122._20_4_;
          auVar79._24_4_ = auVar169._24_4_ * auVar122._24_4_;
          auVar79._28_4_ = auVar122._28_4_;
          auVar122 = vminps_avx(auVar78,auVar79);
          auVar75 = vsubps_avx(*(undefined1 (*) [32])(uVar110 + 0x40 + (uVar114 ^ 0x20)),
                               auVar152._0_32_);
          auVar88._4_4_ = auVar127._4_4_ * auVar75._4_4_;
          auVar88._0_4_ = auVar127._0_4_ * auVar75._0_4_;
          auVar88._8_4_ = auVar127._8_4_ * auVar75._8_4_;
          auVar88._12_4_ = auVar127._12_4_ * auVar75._12_4_;
          auVar88._16_4_ = auVar127._16_4_ * auVar75._16_4_;
          auVar88._20_4_ = auVar127._20_4_ * auVar75._20_4_;
          auVar88._24_4_ = auVar127._24_4_ * auVar75._24_4_;
          auVar88._28_4_ = auVar75._28_4_;
          auVar75 = vminps_avx(auVar88,auVar144._0_32_);
          auVar122 = vminps_avx(auVar122,auVar75);
          auVar116 = vcmpps_avx(auVar116,auVar122,2);
          uVar107 = vmovmskps_avx(auVar116);
          if (uVar107 == 0) {
            if (puVar112 == &local_1200) {
              return;
            }
            goto LAB_002ea019;
          }
          uVar107 = uVar107 & 0xff;
          uVar105 = uVar110 & 0xfffffffffffffff0;
          lVar9 = 0;
          if (uVar107 != 0) {
            for (; (uVar107 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
            }
          }
          uVar110 = *(ulong *)(uVar105 + lVar9 * 8);
          uVar107 = uVar107 - 1 & uVar107;
          if (uVar107 != 0) {
            *puVar112 = uVar110;
            puVar112 = puVar112 + 1;
            lVar9 = 0;
            if (uVar107 != 0) {
              for (; (uVar107 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
              }
            }
            uVar110 = *(ulong *)(uVar105 + lVar9 * 8);
            uVar107 = uVar107 - 1 & uVar107;
            uVar108 = (ulong)uVar107;
            if (uVar107 != 0) {
              do {
                *puVar112 = uVar110;
                puVar112 = puVar112 + 1;
                lVar9 = 0;
                if (uVar108 != 0) {
                  for (; (uVar108 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
                  }
                }
                uVar110 = *(ulong *)(uVar105 + lVar9 * 8);
                uVar108 = uVar108 & uVar108 - 1;
              } while (uVar108 != 0);
            }
          }
        }
        local_1628 = (ulong)((uint)uVar110 & 0xf) - 8;
        if (local_1628 != 0) {
          uVar110 = uVar110 & 0xfffffffffffffff0;
          local_1650 = context->scene;
          local_1638 = 0;
          do {
            lVar106 = local_1638 * 0x60;
            ppfVar4 = (local_1650->vertices).items;
            pfVar5 = ppfVar4[*(uint *)(uVar110 + 0x40 + lVar106)];
            pfVar6 = ppfVar4[*(uint *)(uVar110 + 0x44 + lVar106)];
            pfVar7 = ppfVar4[*(uint *)(uVar110 + 0x48 + lVar106)];
            pfVar8 = ppfVar4[*(uint *)(uVar110 + 0x4c + lVar106)];
            auVar140 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar110 + lVar106)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar110 + 8 + lVar106)));
            auVar129 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar110 + lVar106)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar110 + 8 + lVar106)));
            auVar125 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar110 + 4 + lVar106)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar110 + 0xc + lVar106)));
            auVar10 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar110 + 4 + lVar106)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar110 + 0xc + lVar106)));
            auVar141 = vunpcklps_avx(auVar129,auVar10);
            auVar80 = vunpcklps_avx(auVar140,auVar125);
            auVar129 = vunpckhps_avx(auVar140,auVar125);
            auVar125 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar110 + 0x10 + lVar106)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar110 + 0x18 + lVar106)));
            auVar10 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar110 + 0x10 + lVar106)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar110 + 0x18 + lVar106)));
            auVar126 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar110 + 0x14 + lVar106)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar110 + 0x1c + lVar106)));
            auVar140 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar110 + 0x14 + lVar106)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar110 + 0x1c + lVar106)));
            auVar81 = vunpcklps_avx(auVar10,auVar140);
            auVar82 = vunpcklps_avx(auVar125,auVar126);
            auVar10 = vunpckhps_avx(auVar125,auVar126);
            auVar126 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar110 + 0x20 + lVar106)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar110 + 0x28 + lVar106)));
            auVar140 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar110 + 0x20 + lVar106)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar110 + 0x28 + lVar106)));
            auVar83 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar110 + 0x24 + lVar106)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar110 + 0x2c + lVar106)));
            auVar125 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar110 + 0x24 + lVar106)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar110 + 0x2c + lVar106)));
            auVar84 = vunpcklps_avx(auVar140,auVar125);
            auVar85 = vunpcklps_avx(auVar126,auVar83);
            auVar140 = vunpckhps_avx(auVar126,auVar83);
            auVar83 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar110 + 0x30 + lVar106)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar110 + 0x38 + lVar106)));
            auVar125 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar110 + 0x30 + lVar106)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar110 + 0x38 + lVar106)));
            auVar86 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar110 + 0x34 + lVar106)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar110 + 0x3c + lVar106)));
            auVar126 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar110 + 0x34 + lVar106)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar110 + 0x3c + lVar106)));
            auVar126 = vunpcklps_avx(auVar125,auVar126);
            auVar87 = vunpcklps_avx(auVar83,auVar86);
            auVar125 = vunpckhps_avx(auVar83,auVar86);
            lVar9 = uVar110 + 0x40 + lVar106;
            local_13a0 = *(undefined8 *)(lVar9 + 0x10);
            uStack_1398 = *(undefined8 *)(lVar9 + 0x18);
            uStack_1390 = local_13a0;
            uStack_1388 = uStack_1398;
            lVar106 = uVar110 + 0x50 + lVar106;
            local_13c0 = *(undefined8 *)(lVar106 + 0x10);
            uStack_13b8 = *(undefined8 *)(lVar106 + 0x18);
            uStack_13b0 = local_13c0;
            uStack_13a8 = uStack_13b8;
            auVar130._16_16_ = auVar85;
            auVar130._0_16_ = auVar80;
            auVar142._16_16_ = auVar140;
            auVar142._0_16_ = auVar129;
            auVar148._16_16_ = auVar84;
            auVar148._0_16_ = auVar141;
            auVar118._16_16_ = auVar82;
            auVar118._0_16_ = auVar82;
            auVar145._16_16_ = auVar10;
            auVar145._0_16_ = auVar10;
            auVar123._16_16_ = auVar81;
            auVar123._0_16_ = auVar81;
            auVar159._16_16_ = auVar87;
            auVar159._0_16_ = auVar87;
            auVar168._16_16_ = auVar125;
            auVar168._0_16_ = auVar125;
            auVar117._16_16_ = auVar126;
            auVar117._0_16_ = auVar126;
            local_1620 = vsubps_avx(auVar130,auVar118);
            local_1580 = vsubps_avx(auVar142,auVar145);
            auVar116 = vsubps_avx(auVar148,auVar123);
            auVar122 = vsubps_avx(auVar159,auVar130);
            auVar75 = vsubps_avx(auVar168,auVar142);
            auVar76 = vsubps_avx(auVar117,auVar148);
            fVar135 = auVar76._0_4_;
            fVar170 = local_1580._0_4_;
            fVar15 = auVar76._4_4_;
            fVar172 = local_1580._4_4_;
            auVar89._4_4_ = fVar172 * fVar15;
            auVar89._0_4_ = fVar170 * fVar135;
            fVar25 = auVar76._8_4_;
            fVar173 = local_1580._8_4_;
            auVar89._8_4_ = fVar173 * fVar25;
            fVar35 = auVar76._12_4_;
            fVar174 = local_1580._12_4_;
            auVar89._12_4_ = fVar174 * fVar35;
            fVar45 = auVar76._16_4_;
            fVar175 = local_1580._16_4_;
            auVar89._16_4_ = fVar175 * fVar45;
            fVar55 = auVar76._20_4_;
            fVar176 = local_1580._20_4_;
            auVar89._20_4_ = fVar176 * fVar55;
            fVar65 = auVar76._24_4_;
            fVar177 = local_1580._24_4_;
            auVar89._24_4_ = fVar177 * fVar65;
            auVar89._28_4_ = auVar126._12_4_;
            fVar137 = auVar75._0_4_;
            fVar150 = auVar116._0_4_;
            fVar16 = auVar75._4_4_;
            fVar153 = auVar116._4_4_;
            auVar91._4_4_ = fVar153 * fVar16;
            auVar91._0_4_ = fVar150 * fVar137;
            fVar26 = auVar75._8_4_;
            fVar154 = auVar116._8_4_;
            auVar91._8_4_ = fVar154 * fVar26;
            fVar36 = auVar75._12_4_;
            fVar155 = auVar116._12_4_;
            auVar91._12_4_ = fVar155 * fVar36;
            fVar46 = auVar75._16_4_;
            fVar156 = auVar116._16_4_;
            auVar91._16_4_ = fVar156 * fVar46;
            fVar56 = auVar75._20_4_;
            fVar157 = auVar116._20_4_;
            auVar91._20_4_ = fVar157 * fVar56;
            fVar66 = auVar75._24_4_;
            uVar90 = auVar82._12_4_;
            fVar158 = auVar116._24_4_;
            auVar91._24_4_ = fVar158 * fVar66;
            auVar91._28_4_ = uVar90;
            local_1540 = vsubps_avx(auVar91,auVar89);
            fVar139 = auVar122._0_4_;
            fVar17 = auVar122._4_4_;
            auVar92._4_4_ = fVar153 * fVar17;
            auVar92._0_4_ = fVar150 * fVar139;
            fVar27 = auVar122._8_4_;
            auVar92._8_4_ = fVar154 * fVar27;
            fVar37 = auVar122._12_4_;
            auVar92._12_4_ = fVar155 * fVar37;
            fVar47 = auVar122._16_4_;
            auVar92._16_4_ = fVar156 * fVar47;
            fVar57 = auVar122._20_4_;
            auVar92._20_4_ = fVar157 * fVar57;
            fVar67 = auVar122._24_4_;
            auVar92._24_4_ = fVar158 * fVar67;
            auVar92._28_4_ = uVar90;
            fVar136 = local_1620._0_4_;
            fVar18 = local_1620._4_4_;
            auVar93._4_4_ = fVar15 * fVar18;
            auVar93._0_4_ = fVar135 * fVar136;
            fVar28 = local_1620._8_4_;
            auVar93._8_4_ = fVar25 * fVar28;
            fVar38 = local_1620._12_4_;
            auVar93._12_4_ = fVar35 * fVar38;
            fVar48 = local_1620._16_4_;
            auVar93._16_4_ = fVar45 * fVar48;
            fVar58 = local_1620._20_4_;
            auVar93._20_4_ = fVar55 * fVar58;
            fVar68 = local_1620._24_4_;
            auVar93._24_4_ = fVar65 * fVar68;
            auVar93._28_4_ = auVar81._12_4_;
            auVar116 = vsubps_avx(auVar93,auVar92);
            auVar94._4_4_ = fVar16 * fVar18;
            auVar94._0_4_ = fVar137 * fVar136;
            auVar94._8_4_ = fVar26 * fVar28;
            auVar94._12_4_ = fVar36 * fVar38;
            auVar94._16_4_ = fVar46 * fVar48;
            auVar94._20_4_ = fVar56 * fVar58;
            auVar94._24_4_ = fVar66 * fVar68;
            auVar94._28_4_ = auVar81._12_4_;
            auVar95._4_4_ = fVar172 * fVar17;
            auVar95._0_4_ = fVar170 * fVar139;
            auVar95._8_4_ = fVar173 * fVar27;
            auVar95._12_4_ = fVar174 * fVar37;
            auVar95._16_4_ = fVar175 * fVar47;
            auVar95._20_4_ = fVar176 * fVar57;
            auVar95._24_4_ = fVar177 * fVar67;
            auVar95._28_4_ = local_1580._28_4_;
            local_15a0 = vsubps_avx(auVar95,auVar94);
            uVar1 = *(undefined4 *)&(ray->org).field_0;
            auVar171._4_4_ = uVar1;
            auVar171._0_4_ = uVar1;
            auVar171._8_4_ = uVar1;
            auVar171._12_4_ = uVar1;
            auVar171._16_4_ = uVar1;
            auVar171._20_4_ = uVar1;
            auVar171._24_4_ = uVar1;
            auVar171._28_4_ = uVar1;
            uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar178._4_4_ = uVar1;
            auVar178._0_4_ = uVar1;
            auVar178._8_4_ = uVar1;
            auVar178._12_4_ = uVar1;
            auVar178._16_4_ = uVar1;
            auVar178._20_4_ = uVar1;
            auVar178._24_4_ = uVar1;
            auVar178._28_4_ = uVar1;
            uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar179._4_4_ = uVar2;
            auVar179._0_4_ = uVar2;
            auVar179._8_4_ = uVar2;
            auVar179._12_4_ = uVar2;
            auVar179._16_4_ = uVar2;
            auVar179._20_4_ = uVar2;
            auVar179._24_4_ = uVar2;
            auVar179._28_4_ = uVar2;
            fVar128 = (ray->dir).field_0.m128[1];
            local_1560 = vsubps_avx(auVar130,auVar171);
            fVar133 = (ray->dir).field_0.m128[2];
            auVar77 = vsubps_avx(auVar142,auVar178);
            auVar78 = vsubps_avx(auVar148,auVar179);
            fVar138 = auVar78._0_4_;
            fVar19 = auVar78._4_4_;
            auVar96._4_4_ = fVar128 * fVar19;
            auVar96._0_4_ = fVar128 * fVar138;
            fVar29 = auVar78._8_4_;
            auVar96._8_4_ = fVar128 * fVar29;
            fVar39 = auVar78._12_4_;
            auVar96._12_4_ = fVar128 * fVar39;
            fVar49 = auVar78._16_4_;
            auVar96._16_4_ = fVar128 * fVar49;
            fVar59 = auVar78._20_4_;
            auVar96._20_4_ = fVar128 * fVar59;
            fVar69 = auVar78._24_4_;
            auVar96._24_4_ = fVar128 * fVar69;
            auVar96._28_4_ = uVar1;
            fVar132 = auVar77._0_4_;
            fVar20 = auVar77._4_4_;
            auVar97._4_4_ = fVar133 * fVar20;
            auVar97._0_4_ = fVar133 * fVar132;
            fVar30 = auVar77._8_4_;
            auVar97._8_4_ = fVar133 * fVar30;
            fVar40 = auVar77._12_4_;
            auVar97._12_4_ = fVar133 * fVar40;
            fVar50 = auVar77._16_4_;
            auVar97._16_4_ = fVar133 * fVar50;
            fVar60 = auVar77._20_4_;
            auVar97._20_4_ = fVar133 * fVar60;
            fVar70 = auVar77._24_4_;
            auVar97._24_4_ = fVar133 * fVar70;
            auVar97._28_4_ = uVar2;
            auVar77 = vsubps_avx(auVar97,auVar96);
            fVar134 = (ray->dir).field_0.m128[0];
            fVar11 = local_1560._0_4_;
            fVar21 = local_1560._4_4_;
            auVar98._4_4_ = fVar133 * fVar21;
            auVar98._0_4_ = fVar133 * fVar11;
            fVar31 = local_1560._8_4_;
            auVar98._8_4_ = fVar133 * fVar31;
            fVar41 = local_1560._12_4_;
            auVar98._12_4_ = fVar133 * fVar41;
            fVar51 = local_1560._16_4_;
            auVar98._16_4_ = fVar133 * fVar51;
            fVar61 = local_1560._20_4_;
            auVar98._20_4_ = fVar133 * fVar61;
            fVar71 = local_1560._24_4_;
            auVar98._24_4_ = fVar133 * fVar71;
            auVar98._28_4_ = local_1540._28_4_;
            auVar99._4_4_ = fVar134 * fVar19;
            auVar99._0_4_ = fVar134 * fVar138;
            auVar99._8_4_ = fVar134 * fVar29;
            auVar99._12_4_ = fVar134 * fVar39;
            auVar99._16_4_ = fVar134 * fVar49;
            auVar99._20_4_ = fVar134 * fVar59;
            auVar99._24_4_ = fVar134 * fVar69;
            auVar99._28_4_ = uVar90;
            auVar78 = vsubps_avx(auVar99,auVar98);
            auVar100._4_4_ = fVar134 * fVar20;
            auVar100._0_4_ = fVar134 * fVar132;
            auVar100._8_4_ = fVar134 * fVar30;
            auVar100._12_4_ = fVar134 * fVar40;
            auVar100._16_4_ = fVar134 * fVar50;
            auVar100._20_4_ = fVar134 * fVar60;
            auVar100._24_4_ = fVar134 * fVar70;
            auVar100._28_4_ = uVar90;
            auVar101._4_4_ = fVar128 * fVar21;
            auVar101._0_4_ = fVar128 * fVar11;
            auVar101._8_4_ = fVar128 * fVar31;
            auVar101._12_4_ = fVar128 * fVar41;
            auVar101._16_4_ = fVar128 * fVar51;
            auVar101._20_4_ = fVar128 * fVar61;
            auVar101._24_4_ = fVar128 * fVar71;
            auVar101._28_4_ = local_1560._28_4_;
            auVar79 = vsubps_avx(auVar101,auVar100);
            fVar12 = local_15a0._0_4_;
            fVar22 = local_15a0._4_4_;
            fVar32 = local_15a0._8_4_;
            fVar42 = local_15a0._12_4_;
            fVar52 = local_15a0._16_4_;
            fVar62 = local_15a0._20_4_;
            fVar72 = local_15a0._24_4_;
            fVar13 = auVar116._0_4_;
            fVar23 = auVar116._4_4_;
            fVar33 = auVar116._8_4_;
            fVar43 = auVar116._12_4_;
            fVar53 = auVar116._16_4_;
            fVar63 = auVar116._20_4_;
            fVar73 = auVar116._24_4_;
            fVar14 = local_1540._0_4_;
            fVar24 = local_1540._4_4_;
            fVar34 = local_1540._8_4_;
            fVar44 = local_1540._12_4_;
            fVar54 = local_1540._16_4_;
            fVar64 = local_1540._20_4_;
            fVar74 = local_1540._24_4_;
            auVar124._0_4_ = fVar134 * fVar14 + fVar128 * fVar13 + fVar133 * fVar12;
            auVar124._4_4_ = fVar134 * fVar24 + fVar128 * fVar23 + fVar133 * fVar22;
            auVar124._8_4_ = fVar134 * fVar34 + fVar128 * fVar33 + fVar133 * fVar32;
            auVar124._12_4_ = fVar134 * fVar44 + fVar128 * fVar43 + fVar133 * fVar42;
            auVar124._16_4_ = fVar134 * fVar54 + fVar128 * fVar53 + fVar133 * fVar52;
            auVar124._20_4_ = fVar134 * fVar64 + fVar128 * fVar63 + fVar133 * fVar62;
            auVar124._24_4_ = fVar134 * fVar74 + fVar128 * fVar73 + fVar133 * fVar72;
            auVar124._28_4_ = fVar133 + fVar133 + local_1560._28_4_;
            auVar119._8_4_ = 0x80000000;
            auVar119._0_8_ = 0x8000000080000000;
            auVar119._12_4_ = 0x80000000;
            auVar119._16_4_ = 0x80000000;
            auVar119._20_4_ = 0x80000000;
            auVar119._24_4_ = 0x80000000;
            auVar119._28_4_ = 0x80000000;
            auVar116 = vandps_avx(auVar124,auVar119);
            uVar107 = auVar116._0_4_;
            auVar146._0_4_ =
                 (float)(uVar107 ^
                        (uint)(fVar139 * auVar77._0_4_ +
                              fVar137 * auVar78._0_4_ + fVar135 * auVar79._0_4_));
            uVar161 = auVar116._4_4_;
            auVar146._4_4_ =
                 (float)(uVar161 ^
                        (uint)(fVar17 * auVar77._4_4_ +
                              fVar16 * auVar78._4_4_ + fVar15 * auVar79._4_4_));
            uVar162 = auVar116._8_4_;
            auVar146._8_4_ =
                 (float)(uVar162 ^
                        (uint)(fVar27 * auVar77._8_4_ +
                              fVar26 * auVar78._8_4_ + fVar25 * auVar79._8_4_));
            uVar163 = auVar116._12_4_;
            auVar146._12_4_ =
                 (float)(uVar163 ^
                        (uint)(fVar37 * auVar77._12_4_ +
                              fVar36 * auVar78._12_4_ + fVar35 * auVar79._12_4_));
            uVar164 = auVar116._16_4_;
            auVar146._16_4_ =
                 (float)(uVar164 ^
                        (uint)(fVar47 * auVar77._16_4_ +
                              fVar46 * auVar78._16_4_ + fVar45 * auVar79._16_4_));
            uVar165 = auVar116._20_4_;
            auVar146._20_4_ =
                 (float)(uVar165 ^
                        (uint)(fVar57 * auVar77._20_4_ +
                              fVar56 * auVar78._20_4_ + fVar55 * auVar79._20_4_));
            uVar166 = auVar116._24_4_;
            auVar146._24_4_ =
                 (float)(uVar166 ^
                        (uint)(fVar67 * auVar77._24_4_ +
                              fVar66 * auVar78._24_4_ + fVar65 * auVar79._24_4_));
            uVar167 = auVar116._28_4_;
            auVar146._28_4_ =
                 (float)(uVar167 ^ (uint)(auVar122._28_4_ + auVar75._28_4_ + auVar76._28_4_));
            auVar151._0_4_ =
                 (float)(uVar107 ^
                        (uint)(auVar77._0_4_ * fVar136 +
                              auVar78._0_4_ * fVar170 + fVar150 * auVar79._0_4_));
            auVar151._4_4_ =
                 (float)(uVar161 ^
                        (uint)(auVar77._4_4_ * fVar18 +
                              auVar78._4_4_ * fVar172 + fVar153 * auVar79._4_4_));
            auVar151._8_4_ =
                 (float)(uVar162 ^
                        (uint)(auVar77._8_4_ * fVar28 +
                              auVar78._8_4_ * fVar173 + fVar154 * auVar79._8_4_));
            auVar151._12_4_ =
                 (float)(uVar163 ^
                        (uint)(auVar77._12_4_ * fVar38 +
                              auVar78._12_4_ * fVar174 + fVar155 * auVar79._12_4_));
            auVar151._16_4_ =
                 (float)(uVar164 ^
                        (uint)(auVar77._16_4_ * fVar48 +
                              auVar78._16_4_ * fVar175 + fVar156 * auVar79._16_4_));
            auVar151._20_4_ =
                 (float)(uVar165 ^
                        (uint)(auVar77._20_4_ * fVar58 +
                              auVar78._20_4_ * fVar176 + fVar157 * auVar79._20_4_));
            auVar151._24_4_ =
                 (float)(uVar166 ^
                        (uint)(auVar77._24_4_ * fVar68 +
                              auVar78._24_4_ * fVar177 + fVar158 * auVar79._24_4_));
            auVar151._28_4_ = (float)(uVar167 ^ (uint)(auVar78._28_4_ + auVar79._28_4_ + -0.0));
            auVar122 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar116 = vcmpps_avx(auVar146,auVar122,5);
            auVar122 = vcmpps_avx(auVar151,auVar122,5);
            auVar116 = vandps_avx(auVar116,auVar122);
            auVar120._8_4_ = 0x7fffffff;
            auVar120._0_8_ = 0x7fffffff7fffffff;
            auVar120._12_4_ = 0x7fffffff;
            auVar120._16_4_ = 0x7fffffff;
            auVar120._20_4_ = 0x7fffffff;
            auVar120._24_4_ = 0x7fffffff;
            auVar120._28_4_ = 0x7fffffff;
            local_1320 = vandps_avx(auVar124,auVar120);
            auVar122 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar124,4);
            auVar116 = vandps_avx(auVar116,auVar122);
            auVar121._0_4_ = auVar151._0_4_ + auVar146._0_4_;
            auVar121._4_4_ = auVar151._4_4_ + auVar146._4_4_;
            auVar121._8_4_ = auVar151._8_4_ + auVar146._8_4_;
            auVar121._12_4_ = auVar151._12_4_ + auVar146._12_4_;
            auVar121._16_4_ = auVar151._16_4_ + auVar146._16_4_;
            auVar121._20_4_ = auVar151._20_4_ + auVar146._20_4_;
            auVar121._24_4_ = auVar151._24_4_ + auVar146._24_4_;
            auVar121._28_4_ = auVar151._28_4_ + auVar146._28_4_;
            auVar75 = vcmpps_avx(auVar121,local_1320,2);
            auVar122 = vandps_avx(auVar116,auVar75);
            auVar76 = local_1520 & auVar122;
            if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar76 >> 0x7f,0) != '\0') ||
                  (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar76 >> 0xbf,0) != '\0') ||
                (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar76[0x1f] < '\0') {
              auVar122 = vandps_avx(auVar122,local_1520);
              local_1340._0_4_ =
                   (float)(uVar107 ^ (uint)(fVar14 * fVar11 + fVar13 * fVar132 + fVar138 * fVar12));
              local_1340._4_4_ =
                   (float)(uVar161 ^ (uint)(fVar24 * fVar21 + fVar23 * fVar20 + fVar19 * fVar22));
              local_1340._8_4_ =
                   (float)(uVar162 ^ (uint)(fVar34 * fVar31 + fVar33 * fVar30 + fVar29 * fVar32));
              local_1340._12_4_ =
                   (float)(uVar163 ^ (uint)(fVar44 * fVar41 + fVar43 * fVar40 + fVar39 * fVar42));
              local_1340._16_4_ =
                   (float)(uVar164 ^ (uint)(fVar54 * fVar51 + fVar53 * fVar50 + fVar49 * fVar52));
              local_1340._20_4_ =
                   (float)(uVar165 ^ (uint)(fVar64 * fVar61 + fVar63 * fVar60 + fVar59 * fVar62));
              local_1340._24_4_ =
                   (float)(uVar166 ^ (uint)(fVar74 * fVar71 + fVar73 * fVar70 + fVar69 * fVar72));
              local_1340._28_4_ =
                   uVar167 ^ (uint)(auVar75._28_4_ + auVar75._28_4_ + auVar116._28_4_);
              fVar128 = (ray->org).field_0.m128[3];
              fVar133 = local_1320._0_4_;
              fVar134 = local_1320._4_4_;
              auVar102._4_4_ = fVar134 * fVar128;
              auVar102._0_4_ = fVar133 * fVar128;
              fVar135 = local_1320._8_4_;
              auVar102._8_4_ = fVar135 * fVar128;
              fVar137 = local_1320._12_4_;
              auVar102._12_4_ = fVar137 * fVar128;
              fVar139 = local_1320._16_4_;
              auVar102._16_4_ = fVar139 * fVar128;
              fVar136 = local_1320._20_4_;
              auVar102._20_4_ = fVar136 * fVar128;
              fVar138 = local_1320._24_4_;
              auVar102._24_4_ = fVar138 * fVar128;
              auVar102._28_4_ = fVar128;
              auVar116 = vcmpps_avx(auVar102,local_1340,1);
              fVar128 = ray->tfar;
              auVar103._4_4_ = fVar134 * fVar128;
              auVar103._0_4_ = fVar133 * fVar128;
              auVar103._8_4_ = fVar135 * fVar128;
              auVar103._12_4_ = fVar137 * fVar128;
              auVar103._16_4_ = fVar139 * fVar128;
              auVar103._20_4_ = fVar136 * fVar128;
              auVar103._24_4_ = fVar138 * fVar128;
              auVar103._28_4_ = fVar128;
              auVar75 = vcmpps_avx(local_1340,auVar103,2);
              auVar116 = vandps_avx(auVar75,auVar116);
              auVar75 = auVar122 & auVar116;
              if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar75 >> 0x7f,0) != '\0') ||
                    (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar75 >> 0xbf,0) != '\0') ||
                  (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar75[0x1f] < '\0') {
                local_12e0 = vandps_avx(auVar122,auVar116);
                auVar116 = vsubps_avx(local_1320,auVar151);
                local_1380 = vblendvps_avx(auVar146,auVar116,local_14e0);
                auVar116 = vsubps_avx(local_1320,auVar146);
                local_1360 = vblendvps_avx(auVar151,auVar116,local_14e0);
                uStack_1244 = local_14e0._28_4_;
                local_1260[0] = fVar14 * (float)local_1500._0_4_;
                local_1260[1] = fVar24 * (float)local_1500._4_4_;
                local_1260[2] = fVar34 * fStack_14f8;
                local_1260[3] = fVar44 * fStack_14f4;
                fStack_1250 = fVar54 * fStack_14f0;
                fStack_124c = fVar64 * fStack_14ec;
                fStack_1248 = fVar74 * fStack_14e8;
                local_1240[0] = fVar13 * (float)local_1500._0_4_;
                local_1240[1] = fVar23 * (float)local_1500._4_4_;
                local_1240[2] = fVar33 * fStack_14f8;
                local_1240[3] = fVar43 * fStack_14f4;
                fStack_1230 = fVar53 * fStack_14f0;
                fStack_122c = fVar63 * fStack_14ec;
                fStack_1228 = fVar73 * fStack_14e8;
                uStack_1224 = uStack_1244;
                auVar116 = vrcpps_avx(local_1320);
                local_1220[0] = (float)local_1500._0_4_ * fVar12;
                local_1220[1] = (float)local_1500._4_4_ * fVar22;
                local_1220[2] = fStack_14f8 * fVar32;
                local_1220[3] = fStack_14f4 * fVar42;
                fStack_1210 = fStack_14f0 * fVar52;
                fStack_120c = fStack_14ec * fVar62;
                fStack_1208 = fStack_14e8 * fVar72;
                uStack_1204 = uStack_1244;
                fVar128 = auVar116._0_4_;
                fVar132 = auVar116._4_4_;
                auVar104._4_4_ = fVar134 * fVar132;
                auVar104._0_4_ = fVar133 * fVar128;
                fVar133 = auVar116._8_4_;
                auVar104._8_4_ = fVar135 * fVar133;
                fVar134 = auVar116._12_4_;
                auVar104._12_4_ = fVar137 * fVar134;
                fVar135 = auVar116._16_4_;
                auVar104._16_4_ = fVar139 * fVar135;
                fVar137 = auVar116._20_4_;
                auVar104._20_4_ = fVar136 * fVar137;
                fVar139 = auVar116._24_4_;
                auVar104._24_4_ = fVar138 * fVar139;
                auVar104._28_4_ = local_1320._28_4_;
                auVar143._8_4_ = 0x3f800000;
                auVar143._0_8_ = 0x3f8000003f800000;
                auVar143._12_4_ = 0x3f800000;
                auVar143._16_4_ = 0x3f800000;
                auVar143._20_4_ = 0x3f800000;
                auVar143._24_4_ = 0x3f800000;
                auVar143._28_4_ = 0x3f800000;
                auVar116 = vsubps_avx(auVar143,auVar104);
                fVar128 = fVar128 + fVar128 * auVar116._0_4_;
                fVar132 = fVar132 + fVar132 * auVar116._4_4_;
                fVar133 = fVar133 + fVar133 * auVar116._8_4_;
                fVar134 = fVar134 + fVar134 * auVar116._12_4_;
                fVar135 = fVar135 + fVar135 * auVar116._16_4_;
                fVar137 = fVar137 + fVar137 * auVar116._20_4_;
                fVar139 = fVar139 + fVar139 * auVar116._24_4_;
                local_1280._4_4_ = fVar132 * local_1340._4_4_;
                local_1280._0_4_ = fVar128 * local_1340._0_4_;
                local_1280._8_4_ = fVar133 * local_1340._8_4_;
                local_1280._12_4_ = fVar134 * local_1340._12_4_;
                local_1280._16_4_ = fVar135 * local_1340._16_4_;
                local_1280._20_4_ = fVar137 * local_1340._20_4_;
                local_1280._24_4_ = fVar139 * local_1340._24_4_;
                local_1280._28_4_ = local_1340._28_4_;
                local_12c0[0] = local_1380._0_4_ * fVar128;
                local_12c0[1] = local_1380._4_4_ * fVar132;
                local_12c0[2] = local_1380._8_4_ * fVar133;
                local_12c0[3] = local_1380._12_4_ * fVar134;
                fStack_12b0 = local_1380._16_4_ * fVar135;
                fStack_12ac = local_1380._20_4_ * fVar137;
                fStack_12a8 = local_1380._24_4_ * fVar139;
                uStack_12a4 = local_1380._28_4_;
                local_12a0._4_4_ = local_1360._4_4_ * fVar132;
                local_12a0._0_4_ = local_1360._0_4_ * fVar128;
                local_12a0._8_4_ = local_1360._8_4_ * fVar133;
                local_12a0._12_4_ = local_1360._12_4_ * fVar134;
                local_12a0._16_4_ = local_1360._16_4_ * fVar135;
                local_12a0._20_4_ = local_1360._20_4_ * fVar137;
                local_12a0._24_4_ = local_1360._24_4_ * fVar139;
                local_12a0._28_4_ = local_1380._28_4_;
                uVar107 = vmovmskps_avx(local_12e0);
                uVar109 = (ulong)uVar107;
                do {
                  local_1640 = 0;
                  if (uVar109 != 0) {
                    for (; (uVar109 >> local_1640 & 1) == 0; local_1640 = local_1640 + 1) {
                    }
                  }
                  local_15e8 = *(uint *)((long)&local_13a0 + local_1640 * 4);
                  local_1648 = (local_1650->geometries).items[local_15e8].ptr;
                  if ((local_1648->mask & ray->mask) == 0) {
                    uVar109 = uVar109 ^ 1L << (local_1640 & 0x3f);
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (local_1648->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002ea852;
                    local_1620._0_8_ = context->args;
                    local_1560._0_8_ = uVar109;
                    local_15a0._0_8_ = uVar113;
                    local_1540._0_8_ = puVar112;
                    local_15d0.context = context->user;
                    local_1600 = local_1260[local_1640];
                    local_15fc = local_1240[local_1640];
                    local_15f8 = local_1220[local_1640];
                    local_15f4 = local_12c0[local_1640];
                    local_15f0 = *(undefined4 *)(local_12a0 + local_1640 * 4);
                    local_15ec = *(undefined4 *)((long)&local_13c0 + local_1640 * 4);
                    local_15e4 = (local_15d0.context)->instID[0];
                    local_15e0 = (local_15d0.context)->instPrimID[0];
                    fVar128 = ray->tfar;
                    ray->tfar = local_1260[local_1640 - 8];
                    local_1654 = -1;
                    local_15d0.valid = &local_1654;
                    local_15d0.geometryUserPtr = local_1648->userPtr;
                    local_1580._0_8_ = ray;
                    local_15d0.hit = (RTCHitN *)&local_1600;
                    local_15d0.N = 1;
                    local_15d0.ray = (RTCRayN *)ray;
                    if ((local_1648->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*local_1648->occlusionFilterN)(&local_15d0), *local_15d0.valid != 0)) {
                      ray = (Ray *)local_1580._0_8_;
                      if ((*(code **)(local_1620._0_8_ + 0x10) == (code *)0x0) ||
                         (((*(byte *)local_1620._0_8_ & 2) == 0 &&
                          (((local_1648->field_8).field_0x2 & 0x40) == 0)))) {
LAB_002ea852:
                        ray->tfar = -INFINITY;
                        return;
                      }
                      (**(code **)(local_1620._0_8_ + 0x10))(&local_15d0);
                      ray = (Ray *)local_1580._0_8_;
                      if (*local_15d0.valid != 0) goto LAB_002ea852;
                    }
                    *(float *)(local_1580._0_8_ + 0x20) = fVar128;
                    uVar109 = local_1560._0_8_ ^ 1L << (local_1640 & 0x3f);
                    ray = (Ray *)local_1580._0_8_;
                    puVar112 = (ulong *)local_1540._0_8_;
                    uVar113 = local_15a0._0_8_;
                  }
                } while (uVar109 != 0);
              }
            }
            local_1638 = local_1638 + 1;
          } while (local_1638 != local_1628);
        }
        auVar147 = ZEXT3264(local_13e0);
        auVar149 = ZEXT3264(local_1400);
        auVar152 = ZEXT3264(local_1420);
        auVar160 = ZEXT3264(local_1440);
        auVar169 = ZEXT3264(local_1460);
        auVar127 = ZEXT3264(local_1480);
        auVar131 = ZEXT3264(local_14a0);
        auVar144 = ZEXT3264(local_14c0);
        uVar109 = local_1630;
      } while (puVar112 != &local_1200);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }